

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O1

void __thiscall
pstore::error_or<std::__cxx11::string>::error_or<char_const(&)[2],void>
          (error_or<std::__cxx11::string> *this,char (*other) [2])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  
  this[0x20] = (error_or<std::__cxx11::string>)0x0;
  pbVar1 = value_storage_impl<pstore::error_or<std::__cxx11::string>&,std::__cxx11::string>
                     ((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this);
  (pbVar1->_M_dataplus)._M_p = (pointer)&pbVar1->field_2;
  sVar2 = strlen(*other);
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar1,other,*other + sVar2);
  return;
}

Assistant:

explicit error_or (Other && other)
                : has_error_{false} {
            new (get_storage ()) storage_type (std::forward<Other> (other));
        }